

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

char * __thiscall
tinyxml2::XMLNode::ParseDeep(XMLNode *this,char *p,StrPair *parentEndTag,int *curLineNumPtr)

{
  int *piVar1;
  int lineNum;
  XMLDocument *this_00;
  XMLDocument *pXVar2;
  XMLNode *node_00;
  bool bVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  XMLNode *this_01;
  char *q;
  XMLNode *node;
  StrPair endTag;
  undefined4 extraout_var_04;
  
  this_00 = this->_document;
  XMLDocument::PushDepth(this_00);
  if (this->_document->_errorID == XML_SUCCESS) {
    while( true ) {
      if ((p == (char *)0x0) || (*p == '\0')) goto LAB_0012747d;
      node = (XMLNode *)0x0;
      pcVar6 = XMLDocument::Identify(this->_document,p,&node);
      node_00 = node;
      if (node == (XMLNode *)0x0) goto LAB_0012747d;
      lineNum = node->_parseLineNum;
      endTag._flags = 0;
      endTag._start = (char *)0x0;
      endTag._end = (char *)0x0;
      iVar4 = (*node->_vptr_XMLNode[0x11])(node,pcVar6,&endTag);
      p = (char *)CONCAT44(extraout_var,iVar4);
      if (p == (char *)0x0) break;
      iVar4 = (*node_00->_vptr_XMLNode[4])(node_00);
      if (((XMLNode *)CONCAT44(extraout_var_00,iVar4) != (XMLNode *)0x0) &&
         ((iVar5 = (*this->_vptr_XMLNode[3])(this), CONCAT44(extraout_var_01,iVar5) == 0 ||
          ((this->_firstChild != (XMLNode *)0x0 &&
           (((iVar5 = (*this->_firstChild->_vptr_XMLNode[4])(), CONCAT44(extraout_var_02,iVar5) == 0
             || (this->_lastChild == (XMLNode *)0x0)) ||
            (iVar5 = (*this->_lastChild->_vptr_XMLNode[4])(), CONCAT44(extraout_var_03,iVar5) == 0))
           )))))) {
        pXVar2 = this->_document;
        pcVar6 = Value((XMLNode *)CONCAT44(extraout_var_00,iVar4));
        XMLDocument::SetError
                  (pXVar2,XML_ERROR_PARSING_DECLARATION,lineNum,"XMLDeclaration value=%s",pcVar6);
        DeleteNode(node_00);
        goto LAB_00127473;
      }
      iVar4 = (**node_00->_vptr_XMLNode)(node_00);
      this_01 = (XMLNode *)CONCAT44(extraout_var_04,iVar4);
      if (this_01 != (XMLNode *)0x0) {
        iVar4 = *(int *)&this_01[1]._vptr_XMLNode;
        if (iVar4 != 2) {
          if (endTag._start == endTag._end) {
            if (iVar4 != 0) goto LAB_001273d6;
          }
          else if (iVar4 == 0) {
            pcVar6 = StrPair::GetStr(&endTag);
            q = Value(this_01);
            bVar3 = XMLUtil::StringEqual(pcVar6,q,0x7fffffff);
            if (bVar3) goto LAB_001273d6;
          }
          pXVar2 = this->_document;
          pcVar6 = Value(this_01);
          XMLDocument::SetError
                    (pXVar2,XML_ERROR_MISMATCHED_ELEMENT,lineNum,"XMLElement name=%s",pcVar6);
          DeleteNode(node_00);
          goto LAB_00127473;
        }
        if (parentEndTag != (StrPair *)0x0) {
          StrPair::TransferTo(&this_01->_value,parentEndTag);
        }
        (*node_00->_memPool->_vptr_MemPool[5])();
        DeleteNode(node_00);
        StrPair::Reset(&endTag);
        goto LAB_00127480;
      }
LAB_001273d6:
      InsertEndChild(this,node_00);
      StrPair::Reset(&endTag);
    }
    DeleteNode(node_00);
    if (this->_document->_errorID == XML_SUCCESS) {
      XMLDocument::SetError(this->_document,XML_ERROR_PARSING,lineNum,(char *)0x0);
    }
LAB_00127473:
    StrPair::Reset(&endTag);
  }
LAB_0012747d:
  p = (char *)0x0;
LAB_00127480:
  piVar1 = &this_00->_parsingDepth;
  *piVar1 = *piVar1 + -1;
  return p;
}

Assistant:

char* XMLNode::ParseDeep( char* p, StrPair* parentEndTag, int* curLineNumPtr )
{
    // This is a recursive method, but thinking about it "at the current level"
    // it is a pretty simple flat list:
    //		<foo/>
    //		<!-- comment -->
    //
    // With a special case:
    //		<foo>
    //		</foo>
    //		<!-- comment -->
    //
    // Where the closing element (/foo) *must* be the next thing after the opening
    // element, and the names must match. BUT the tricky bit is that the closing
    // element will be read by the child.
    //
    // 'endTag' is the end tag for this node, it is returned by a call to a child.
    // 'parentEnd' is the end tag for the parent, which is filled in and returned.

	XMLDocument::DepthTracker tracker(_document);
	if (_document->Error())
		return 0;

	while( p && *p ) {
        XMLNode* node = 0;

        p = _document->Identify( p, &node );
        TIXMLASSERT( p );
        if ( node == 0 ) {
            break;
        }

       const int initialLineNum = node->_parseLineNum;

        StrPair endTag;
        p = node->ParseDeep( p, &endTag, curLineNumPtr );
        if ( !p ) {
            DeleteNode( node );
            if ( !_document->Error() ) {
                _document->SetError( XML_ERROR_PARSING, initialLineNum, 0);
            }
            break;
        }

        const XMLDeclaration* const decl = node->ToDeclaration();
        if ( decl ) {
            // Declarations are only allowed at document level
            //
            // Multiple declarations are allowed but all declarations
            // must occur before anything else. 
            //
            // Optimized due to a security test case. If the first node is 
            // a declaration, and the last node is a declaration, then only 
            // declarations have so far been added.
            bool wellLocated = false;

            if (ToDocument()) {
                if (FirstChild()) {
                    wellLocated =
                        FirstChild() &&
                        FirstChild()->ToDeclaration() &&
                        LastChild() &&
                        LastChild()->ToDeclaration();
                }
                else {
                    wellLocated = true;
                }
            }
            if ( !wellLocated ) {
                _document->SetError( XML_ERROR_PARSING_DECLARATION, initialLineNum, "XMLDeclaration value=%s", decl->Value());
                DeleteNode( node );
                break;
            }
        }

        XMLElement* ele = node->ToElement();
        if ( ele ) {
            // We read the end tag. Return it to the parent.
            if ( ele->ClosingType() == XMLElement::CLOSING ) {
                if ( parentEndTag ) {
                    ele->_value.TransferTo( parentEndTag );
                }
                node->_memPool->SetTracked();   // created and then immediately deleted.
                DeleteNode( node );
                return p;
            }

            // Handle an end tag returned to this level.
            // And handle a bunch of annoying errors.
            bool mismatch = false;
            if ( endTag.Empty() ) {
                if ( ele->ClosingType() == XMLElement::OPEN ) {
                    mismatch = true;
                }
            }
            else {
                if ( ele->ClosingType() != XMLElement::OPEN ) {
                    mismatch = true;
                }
                else if ( !XMLUtil::StringEqual( endTag.GetStr(), ele->Name() ) ) {
                    mismatch = true;
                }
            }
            if ( mismatch ) {
                _document->SetError( XML_ERROR_MISMATCHED_ELEMENT, initialLineNum, "XMLElement name=%s", ele->Name());
                DeleteNode( node );
                break;
            }
        }
        InsertEndChild( node );
    }
    return 0;
}